

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

bool llama_model_is_recurrent(llama_model *model)

{
  return (bool)((byte)(0xf00001000000000 >> ((byte)model->arch & 0x3f)) &
               model->arch < LLM_ARCH_GRANITE);
}

Assistant:

bool llama_model_is_recurrent(const llama_model * model) {
    switch (model->arch) {
        case     LLM_ARCH_MAMBA:      return true;
        case     LLM_ARCH_RWKV6:      return true;
        case     LLM_ARCH_RWKV6QWEN2: return true;
        case     LLM_ARCH_RWKV7:      return true;
        case     LLM_ARCH_ARWKV7:     return true;
        default: return false;
    }
}